

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O1

void duckdb::IntegralCompressFunction<unsigned_short,unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  char cVar3;
  undefined2 uVar4;
  ulong count;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  unsigned_long *puVar7;
  allocate_function_ptr_t p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  bool bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  reference pvVar14;
  VectorBuffer *pVVar15;
  idx_t iVar16;
  idx_t iVar17;
  TemplatedValidityData<unsigned_long> *pTVar18;
  ulong uVar19;
  ulong uVar20;
  char cVar21;
  ulong uVar22;
  ulong uVar23;
  unsigned_long uVar24;
  ulong uVar25;
  idx_t idx_in_entry;
  ulong uVar26;
  optional_idx dict_size;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  Vector *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  uVar4 = *(undefined2 *)pvVar14->data;
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = pvVar14->vector_type;
  cVar21 = (char)uVar4;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar5 = result->data;
    pdVar6 = pvVar14->data;
    FlatVector::VerifyFlatVector(pvVar14);
    FlatVector::VerifyFlatVector(result);
    puVar7 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar7 == (unsigned_long *)0x0) {
      if (count == 0) {
        return;
      }
      uVar26 = 0;
      do {
        pdVar5[uVar26] = pdVar6[uVar26 * 2] - cVar21;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
      return;
    }
    (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
    shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
               &(pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
    (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
         (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
    if (count + 0x3f < 0x40) {
      return;
    }
    puVar7 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    uVar22 = 0;
    uVar26 = 0;
    do {
      if (puVar7 == (unsigned_long *)0x0) {
        uVar24 = 0xffffffffffffffff;
      }
      else {
        uVar24 = puVar7[uVar22];
      }
      uVar23 = uVar26 + 0x40;
      if (count <= uVar26 + 0x40) {
        uVar23 = count;
      }
      uVar20 = uVar23;
      if (uVar24 != 0) {
        uVar20 = uVar26;
        if (uVar24 == 0xffffffffffffffff) {
          if (uVar26 < uVar23) {
            do {
              pdVar5[uVar20] = pdVar6[uVar20 * 2] - cVar21;
              uVar20 = uVar20 + 1;
            } while (uVar23 != uVar20);
          }
        }
        else if (uVar26 < uVar23) {
          uVar19 = 0;
          do {
            if ((uVar24 >> (uVar19 & 0x3f) & 1) != 0) {
              pdVar5[uVar26] = pdVar6[uVar26 * 2] - cVar21;
            }
            uVar26 = uVar26 + 1;
            uVar19 = uVar19 + 1;
            uVar20 = uVar26;
          } while (uVar23 != uVar26);
        }
      }
      uVar22 = uVar22 + 1;
      uVar26 = uVar20;
    } while (uVar22 != count + 0x3f >> 6);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      pdVar5 = result->data;
      pdVar6 = pvVar14->data;
      puVar7 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar7 != (unsigned_long *)0x0) && ((*puVar7 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *pdVar5 = *pdVar6 - cVar21;
      return;
    }
    goto LAB_0102007b;
  }
  DictionaryVector::VerifyDictionary(pvVar14);
  pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar14->buffer);
  local_78.sel = (SelectionVector *)pVVar15[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar16 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar16 * 2)) {
LAB_01020071:
    bVar10 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(pvVar14);
    pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar14->auxiliary);
    cVar3 = *(char *)&pVVar15[1]._vptr_VectorBuffer;
    bVar10 = false;
    if (cVar3 == '\0') {
      local_88 = (Vector *)(pVVar15 + 1);
      pdVar5 = result->data;
      pdVar6 = pVVar15[1].data.pointer;
      iVar16 = optional_idx::GetIndex((optional_idx *)&local_78);
      FlatVector::VerifyFlatVector(local_88);
      FlatVector::VerifyFlatVector(result);
      puVar7 = (unsigned_long *)pVVar15[1].data.allocated_size;
      if (puVar7 == (unsigned_long *)0x0) {
        if (iVar16 != 0) {
          iVar17 = 0;
          do {
            pdVar5[iVar17] = pdVar6[iVar17 * 2] - cVar21;
            iVar17 = iVar17 + 1;
          } while (iVar16 != iVar17);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar7;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)(pVVar15 + 2));
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (idx_t)pVVar15[2].aux_data.
                    super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                    .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
        if (0x3f < iVar16 + 0x3f) {
          iVar17 = pVVar15[1].data.allocated_size;
          uVar22 = 0;
          uVar26 = 0;
          do {
            if (iVar17 == 0) {
              uVar23 = 0xffffffffffffffff;
            }
            else {
              uVar23 = *(ulong *)(iVar17 + uVar22 * 8);
            }
            uVar20 = uVar26 + 0x40;
            if (iVar16 <= uVar26 + 0x40) {
              uVar20 = iVar16;
            }
            uVar19 = uVar20;
            if (uVar23 != 0) {
              uVar19 = uVar26;
              if (uVar23 == 0xffffffffffffffff) {
                if (uVar26 < uVar20) {
                  do {
                    pdVar5[uVar19] = pdVar6[uVar19 * 2] - cVar21;
                    uVar19 = uVar19 + 1;
                  } while (uVar20 != uVar19);
                }
              }
              else if (uVar26 < uVar20) {
                uVar25 = 0;
                do {
                  if ((uVar23 >> (uVar25 & 0x3f) & 1) != 0) {
                    pdVar5[uVar26] = pdVar6[uVar26 * 2] - cVar21;
                  }
                  uVar26 = uVar26 + 1;
                  uVar25 = uVar25 + 1;
                  uVar19 = uVar26;
                } while (uVar20 != uVar26);
              }
            }
            uVar22 = uVar22 + 1;
            uVar26 = uVar19;
          } while (uVar22 != iVar16 + 0x3f >> 6);
        }
      }
      DictionaryVector::VerifyDictionary(pvVar14);
      pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar14->buffer);
      iVar16 = optional_idx::GetIndex((optional_idx *)&local_78);
      Vector::Dictionary(result,result,iVar16,(SelectionVector *)(pVVar15 + 1),count);
      bVar10 = true;
    }
    if (cVar3 != '\0') goto LAB_01020071;
  }
  if (bVar10) {
    return;
  }
LAB_0102007b:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(pvVar14,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar13 = local_78.sel;
  pdVar5 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var8 = (allocate_function_ptr_t)pSVar13->sel_vector;
      uVar26 = 0;
      do {
        uVar22 = uVar26;
        if (p_Var8 != (allocate_function_ptr_t)0x0) {
          uVar22 = (ulong)*(uint *)(p_Var8 + uVar26 * 4);
        }
        pdVar5[uVar26] = local_78.data[uVar22 * 2] - cVar21;
        uVar26 = uVar26 + 1;
      } while (count != uVar26);
    }
  }
  else if (count != 0) {
    p_Var8 = (allocate_function_ptr_t)pSVar13->sel_vector;
    uVar26 = 0;
    do {
      uVar22 = uVar26;
      if (p_Var8 != (allocate_function_ptr_t)0x0) {
        uVar22 = (ulong)*(uint *)(p_Var8 + uVar26 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar22 >> 6]
           >> (uVar22 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,&local_80);
          p_Var12 = p_Stack_90;
          peVar11 = local_98;
          local_98 = (element_type *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar11;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var12;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
          }
          pTVar18 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar18->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar26 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar26 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      else {
        pdVar5[uVar26] = local_78.data[uVar22 * 2] - cVar21;
      }
      uVar26 = uVar26 + 1;
    } while (count != uVar26);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}